

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O3

void __thiscall Room::Room(Room *this,int roomNumber,int strength,bool audio,bool video)

{
  int iVar1;
  long lVar2;
  
  (this->super_Model<Room>)._vptr_Model = (_func_int **)&PTR_save_0012c558;
  if (Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    iVar1 = 1;
  }
  else {
    lVar2 = std::_Rb_tree_decrement
                      (&Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header._M_header);
    iVar1 = *(int *)(lVar2 + 0x30) + 1;
  }
  (this->super_Model<Room>).id = iVar1;
  (this->super_Model<Room>)._vptr_Model = (_func_int **)&PTR_save_0012c2e0;
  *(int *)&(this->super_Model<Room>).field_0xc = roomNumber;
  this->strength = strength;
  this->audio = audio;
  this->video = video;
  return;
}

Assistant:

Room::Room(int roomNumber, int strength, bool audio, bool video) : roomNumber(roomNumber), strength(strength),
                                                                   audio(audio), video(video) {}